

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

Operator * getOperator(QSpanData *data,QT_FT_Span *spans,int spanCount)

{
  bool bVar1;
  TextureBlendType TVar2;
  SourceFetchProc p_Var3;
  SourceFetchProc64 p_Var4;
  SourceFetchProcFP p_Var5;
  int in_ECX;
  ulong in_RDX;
  QSpanData *in_RSI;
  Operator *in_RDI;
  float fVar6;
  bool alphaSpans;
  QT_FT_Span *lastSpan;
  bool solidSource;
  QSpanData *in_stack_ffffffffffffffb8;
  Operator *v;
  bool local_15;
  ulong local_10;
  
  v = in_RDI;
  memcpy(in_RDI,&DAT_00bfd5b8,0xb0);
  local_15 = false;
  switch(in_RSI->field_0x88) {
  case 1:
    fVar6 = QColor::alphaF((QColor *)in_stack_ffffffffffffffb8);
    local_15 = 1.0 <= fVar6;
    v->srcFetch = (SourceFetchProc)0x0;
    v->srcFetch64 = (SourceFetchProc64)0x0;
    v->srcFetchFP = (SourceFetchProcFP)0x0;
    break;
  case 2:
    local_15 = (*(byte *)((long)&in_RSI->field_23 + 0x48) & 1) == 0;
    getLinearGradientValues(&(v->field_16).linear,in_RSI);
    v->srcFetch = qt_fetch_linear_gradient;
    v->srcFetch64 = qt_fetch_linear_gradient_rgb64;
    v->srcFetchFP = qt_fetch_linear_gradient_rgbfp;
    break;
  case 3:
    local_15 = (*(byte *)((long)&in_RSI->field_23 + 0x48) & 1) == 0;
    getRadialGradientValues((RadialGradientValues *)v,in_stack_ffffffffffffffb8);
    v->srcFetch = qt_fetch_radial_gradient;
    v->srcFetch64 = qt_fetch_radial_gradient_rgb64;
    v->srcFetchFP = qt_fetch_radial_gradient_rgbfp;
    break;
  case 4:
    local_15 = (*(byte *)((long)&in_RSI->field_23 + 0x48) & 1) == 0;
    v->srcFetch = qt_fetch_conical_gradient;
    v->srcFetch64 = qt_fetch_conical_gradient_rgb64;
    v->srcFetchFP = qt_fetch_conical_gradient_rgbfp;
    break;
  case 5:
    local_15 = (bool)(((in_RSI->field_23).texture.hasAlpha ^ 0xffU) & 1);
    TVar2 = getBlendType(in_RSI);
    p_Var3 = getSourceFetch(TVar2,(in_RSI->field_23).texture.format);
    v->srcFetch = p_Var3;
    TVar2 = getBlendType(in_RSI);
    p_Var4 = getSourceFetch64(TVar2,(in_RSI->field_23).texture.format);
    v->srcFetch64 = p_Var4;
    TVar2 = getBlendType(in_RSI);
    p_Var5 = getSourceFetchFP(TVar2,(in_RSI->field_23).texture.format);
    v->srcFetchFP = p_Var5;
  }
  v->mode = in_RSI->rasterBuffer->compositionMode;
  if ((v->mode == CompositionMode_SourceOver) && (local_15 != false)) {
    v->mode = CompositionMode_Source;
  }
  v->destFetch = destFetchProc[in_RSI->rasterBuffer->format];
  v->destFetch64 = destFetchProc64[in_RSI->rasterBuffer->format];
  v->destFetchFP = destFetchProcFP[in_RSI->rasterBuffer->format];
  if ((v->mode == CompositionMode_Source) &&
     (((*(ushort *)&in_RSI->field_0x88 & 0xff) != 5 ||
      ((in_RSI->field_23).texture.const_alpha == 0x100)))) {
    bVar1 = false;
    for (local_10 = in_RDX; local_10 < in_RDX + (long)in_ECX * 0x10; local_10 = local_10 + 0x10) {
      if (*(char *)(local_10 + 0xc) != -1) {
        bVar1 = true;
        break;
      }
    }
    if ((!bVar1) && (0 < in_ECX)) {
      if (v->destFetch != destFetchARGB32P) {
        v->destFetch = destFetchUndefined;
      }
      if (v->destFetch64 != destFetchRGB64) {
        v->destFetch64 = destFetch64Undefined;
      }
      if (v->destFetchFP != destFetchRGBFP) {
        v->destFetchFP = destFetchFPUndefined;
      }
    }
  }
  v->destStore = destStoreProc[in_RSI->rasterBuffer->format];
  v->funcSolid = functionForModeSolid[v->mode];
  v->func = functionForMode[v->mode];
  v->destStore64 = destStoreProc64[in_RSI->rasterBuffer->format];
  v->funcSolid64 = functionForModeSolid64[v->mode];
  v->func64 = functionForMode64[v->mode];
  v->destStoreFP = destStoreFP;
  v->funcSolidFP = functionForModeSolidFP[v->mode];
  v->funcFP = functionForModeFP[v->mode];
  return in_RDI;
}

Assistant:

static inline Operator getOperator(const QSpanData *data, const QT_FT_Span *spans, int spanCount)
{
    Operator op;
    bool solidSource = false;
    switch(data->type) {
    case QSpanData::Solid:
        solidSource = data->solidColor.alphaF() >= 1.0f;
        op.noGradient = {};
        op.srcFetch = nullptr;
        op.srcFetch64 = nullptr;
        op.srcFetchFP = nullptr;
        break;
    case QSpanData::LinearGradient:
        solidSource = !data->gradient.alphaColor;
        getLinearGradientValues(&op.linear, data);
        op.srcFetch = qt_fetch_linear_gradient;
#if QT_CONFIG(raster_64bit)
        op.srcFetch64 = qt_fetch_linear_gradient_rgb64;
#endif
#if QT_CONFIG(raster_fp)
        op.srcFetchFP = qt_fetch_linear_gradient_rgbfp;
#endif
        break;
    case QSpanData::RadialGradient:
        solidSource = !data->gradient.alphaColor;
        getRadialGradientValues(&op.radial, data);
        op.srcFetch = qt_fetch_radial_gradient;
#if QT_CONFIG(raster_64bit)
        op.srcFetch64 = qt_fetch_radial_gradient_rgb64;
#endif
#if QT_CONFIG(raster_fp)
        op.srcFetchFP = qt_fetch_radial_gradient_rgbfp;
#endif
        break;
    case QSpanData::ConicalGradient:
        solidSource = !data->gradient.alphaColor;
        op.noGradient = {}; // sic!
        op.srcFetch = qt_fetch_conical_gradient;
#if QT_CONFIG(raster_64bit)
        op.srcFetch64 = qt_fetch_conical_gradient_rgb64;
#endif
#if QT_CONFIG(raster_fp)
        op.srcFetchFP = qt_fetch_conical_gradient_rgbfp;
#endif
        break;
    case QSpanData::Texture:
        solidSource = !data->texture.hasAlpha;
        op.noGradient = {};
        op.srcFetch = getSourceFetch(getBlendType(data), data->texture.format);
#if QT_CONFIG(raster_64bit)
        op.srcFetch64 = getSourceFetch64(getBlendType(data), data->texture.format);
#endif
#if QT_CONFIG(raster_fp)
        op.srcFetchFP = getSourceFetchFP(getBlendType(data), data->texture.format);
#endif
        break;
    default:
        Q_UNREACHABLE();
        break;
    }
#if !QT_CONFIG(raster_64bit)
    op.srcFetch64 = nullptr;
#endif
#if !QT_CONFIG(raster_fp)
    op.srcFetchFP = nullptr;
#endif

    op.mode = data->rasterBuffer->compositionMode;
    if (op.mode == QPainter::CompositionMode_SourceOver && solidSource)
        op.mode = QPainter::CompositionMode_Source;

    op.destFetch = destFetchProc[data->rasterBuffer->format];
#if QT_CONFIG(raster_64bit)
    op.destFetch64 = destFetchProc64[data->rasterBuffer->format];
#else
    op.destFetch64 = nullptr;
#endif
#if QT_CONFIG(raster_fp)
    op.destFetchFP = destFetchProcFP[data->rasterBuffer->format];
#else
    op.destFetchFP = nullptr;
#endif
    if (op.mode == QPainter::CompositionMode_Source &&
            (data->type != QSpanData::Texture || data->texture.const_alpha == 256)) {
        const QT_FT_Span *lastSpan = spans + spanCount;
        bool alphaSpans = false;
        while (spans < lastSpan) {
            if (spans->coverage != 255) {
                alphaSpans = true;
                break;
            }
            ++spans;
        }
        if (!alphaSpans && spanCount > 0) {
            // If all spans are opaque we do not need to fetch dest.
            // But don't clear passthrough destFetch as they are just as fast and save destStore.
            if (op.destFetch != destFetchARGB32P)
                op.destFetch = destFetchUndefined;
#if QT_CONFIG(raster_64bit)
            if (op.destFetch64 != destFetchRGB64)
                op.destFetch64 = destFetch64Undefined;
#endif
#if QT_CONFIG(raster_fp)
            if (op.destFetchFP != destFetchRGBFP)
                op.destFetchFP = destFetchFPUndefined;
#endif
        }
    }

    op.destStore = destStoreProc[data->rasterBuffer->format];
    op.funcSolid = functionForModeSolid[op.mode];
    op.func = functionForMode[op.mode];
#if QT_CONFIG(raster_64bit)
    op.destStore64 = destStoreProc64[data->rasterBuffer->format];
    op.funcSolid64 = functionForModeSolid64[op.mode];
    op.func64 = functionForMode64[op.mode];
#else
    op.destStore64 = nullptr;
    op.funcSolid64 = nullptr;
    op.func64 = nullptr;
#endif
#if QT_CONFIG(raster_fp)
    op.destStoreFP = destStoreFP;
    op.funcSolidFP = functionForModeSolidFP[op.mode];
    op.funcFP = functionForModeFP[op.mode];
#else
    op.destStoreFP = nullptr;
    op.funcSolidFP = nullptr;
    op.funcFP = nullptr;
#endif

    return op;
}